

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precondition.cpp
# Opt level: O0

void __thiscall BoundaryElement::precondition_diagonal(BoundaryElement *this,double *z,double *r)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RDX;
  long in_RSI;
  Timer *in_RDI;
  size_t i_1;
  size_t i;
  double potential_coeff_2;
  double potential_coeff_1;
  Timer *in_stack_ffffffffffffffb0;
  size_t local_38;
  ulong local_30;
  
  Timer::start(in_stack_ffffffffffffffb0);
  dVar1 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x278);
  dVar2 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x278);
  local_30 = 0;
  while( true ) {
    sVar3 = Particles::num((Particles *)(in_RDI->start_time_).__d.__r);
    if (sVar3 <= local_30) break;
    *(double *)(in_RSI + local_30 * 8) = *(double *)(in_RDX + local_30 * 8) / ((dVar1 + 1.0) * 0.5);
    local_30 = local_30 + 1;
  }
  local_38 = Particles::num((Particles *)(in_RDI->start_time_).__d.__r);
  while( true ) {
    sVar3 = local_38;
    sVar4 = Particles::num((Particles *)(in_RDI->start_time_).__d.__r);
    if (sVar4 << 1 <= sVar3) break;
    *(double *)(in_RSI + local_38 * 8) =
         *(double *)(in_RDX + local_38 * 8) / ((1.0 / dVar2 + 1.0) * 0.5);
    local_38 = local_38 + 1;
  }
  Timer::stop(in_RDI);
  return;
}

Assistant:

void BoundaryElement::precondition_diagonal(double *z, double *r)
{
    timers_.precondition.start();

    double potential_coeff_1 = 0.5 * (1. +      params_.phys_eps_);
    double potential_coeff_2 = 0.5 * (1. + 1. / params_.phys_eps_);
    
    for (std::size_t i = 0;                i <     elements_.num(); ++i) z[i] = r[i] / potential_coeff_1;
    for (std::size_t i = elements_.num(); i < 2 * elements_.num(); ++i) z[i] = r[i] / potential_coeff_2;

    timers_.precondition.stop();
}